

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_close(PHYSFS_File *_handle)

{
  int iVar1;
  int iVar2;
  
  __PHYSFS_platformGrabMutex(stateLock);
  iVar1 = closeHandleInOpenList(&openReadList,(FileHandle *)_handle);
  if (iVar1 == 0) {
    iVar1 = closeHandleInOpenList(&openWriteList,(FileHandle *)_handle);
    iVar2 = iVar1;
  }
  else {
    iVar2 = 1;
  }
  if (iVar1 == -1) {
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  else {
    __PHYSFS_platformReleaseMutex(stateLock);
    if (iVar2 != 0) {
      return 1;
    }
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  return 0;
}

Assistant:

int PHYSFS_close(PHYSFS_File *_handle)
{
    FileHandle *handle = (FileHandle *) _handle;
    int rc;

    __PHYSFS_platformGrabMutex(stateLock);

    /* -1 == close failure. 0 == not found. 1 == success. */
    rc = closeHandleInOpenList(&openReadList, handle);
    BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    if (!rc)
    {
        rc = closeHandleInOpenList(&openWriteList, handle);
        BAIL_IF_MUTEX_ERRPASS(rc == -1, stateLock, 0);
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    BAIL_IF(!rc, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    return 1;
}